

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

parasail_matrix_t *
parasail_matrix_pssm_create_internal(char *alphabet,int *values,int length,int case_sensitive)

{
  byte bVar1;
  int iVar2;
  size_t i;
  size_t __n;
  int *piVar3;
  int *piVar4;
  __int32_t **pp_Var5;
  char *pcVar6;
  parasail_matrix_t *ppVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  
  if (alphabet == (char *)0x0) {
    pcVar10 = "alphabet";
  }
  else {
    if (values != (int *)0x0) {
      if (length < 1) {
        pcVar10 = "%s: length must be > 0\n";
LAB_00454f6a:
        fprintf(_stderr,pcVar10,"parasail_matrix_pssm_create_internal");
        return (parasail_matrix_t *)0x0;
      }
      __n = strlen(alphabet);
      if (0x7ffffffe < __n) {
        pcVar10 = "%s: alphabet is too large\n";
        goto LAB_00454f6a;
      }
      uVar15 = (ulong)(uint)length;
      pcVar10 = (char *)(uVar15 * (__n + 1) * 4);
      piVar3 = (int *)malloc((size_t)pcVar10);
      if (piVar3 == (int *)0x0) {
        pcVar6 = "%s: failed to malloc %zu bytes\n";
      }
      else {
        iVar12 = -0x80000000;
        iVar9 = 0x7fffffff;
        for (lVar8 = 0; __n * uVar15 - lVar8 != 0; lVar8 = lVar8 + 1) {
          iVar2 = values[lVar8];
          if (iVar2 < iVar9) {
            iVar9 = iVar2;
          }
          if (iVar12 < iVar2) {
            iVar12 = iVar2;
          }
        }
        lVar8 = 0;
        lVar11 = 0;
        piVar4 = piVar3;
        for (uVar13 = 0; uVar13 != uVar15; uVar13 = uVar13 + 1) {
          for (sVar14 = 0; __n != sVar14; sVar14 = sVar14 + 1) {
            piVar4[sVar14] = values[lVar11 + sVar14];
          }
          piVar3[lVar8 + __n] = iVar9;
          lVar8 = lVar8 + __n + 1;
          piVar4 = piVar4 + __n + 1;
          lVar11 = lVar11 + sVar14;
        }
        piVar4 = (int *)malloc(0x400);
        if (piVar4 == (int *)0x0) {
          pcVar6 = "%s: failed to malloc %zu bytes\n";
          pcVar10 = (char *)0x400;
        }
        else {
          for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
            piVar4[lVar8] = (int)__n;
          }
          if (case_sensitive == 0) {
            for (sVar14 = 0; __n != sVar14; sVar14 = sVar14 + 1) {
              pp_Var5 = __ctype_toupper_loc();
              bVar1 = alphabet[sVar14];
              piVar4[(*pp_Var5)[bVar1]] = (int)sVar14;
              pp_Var5 = __ctype_tolower_loc();
              piVar4[(*pp_Var5)[bVar1]] = (int)sVar14;
            }
          }
          else {
            for (sVar14 = 0; __n != sVar14; sVar14 = sVar14 + 1) {
              piVar4[(byte)alphabet[sVar14]] = (int)sVar14;
            }
          }
          pcVar10 = (char *)(__n + 2);
          pcVar6 = (char *)malloc((size_t)pcVar10);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "%s: failed to malloc %zu bytes\n";
          }
          else {
            memcpy(pcVar6,alphabet,__n);
            (pcVar6 + __n)[0] = '*';
            (pcVar6 + __n)[1] = '\0';
            ppVar7 = (parasail_matrix_t *)malloc(0x48);
            if (ppVar7 != (parasail_matrix_t *)0x0) {
              ppVar7->name = "";
              ppVar7->matrix = piVar3;
              ppVar7->mapper = piVar4;
              ppVar7->size = (int)(__n + 1);
              ppVar7->max = iVar12;
              ppVar7->min = iVar9;
              ppVar7->user_matrix = piVar3;
              ppVar7->type = 1;
              ppVar7->length = length;
              ppVar7->alphabet = pcVar6;
              ppVar7->query = (char *)0x0;
              return ppVar7;
            }
            pcVar6 = "%s: failed to malloc %zu bytes\n";
            pcVar10 = (char *)0x48;
          }
        }
      }
      goto LAB_00455000;
    }
    pcVar10 = "values";
  }
  pcVar6 = "%s: missing %s\n";
LAB_00455000:
  fprintf(_stderr,pcVar6,"parasail_matrix_pssm_create_internal",pcVar10);
  return (parasail_matrix_t *)0x0;
}

Assistant:

static parasail_matrix_t* parasail_matrix_pssm_create_internal(
        const char *alphabet, const int *values, const int length, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    int *mapper = NULL;
    char *alphabet_copy = NULL;
    size_t size = 0;
    size_t size1 = 0;
    size_t i = 0;
    size_t j = 0;
    size_t c = 0;
    size_t v = 0;
    int min = INT_MAX;
    int max = INT_MIN;

    PARASAIL_CHECK_NULL(alphabet);
    PARASAIL_CHECK_NULL(values);
    if (length <= 0) {
        fprintf(stderr, "%s: length must be > 0\n", __func__);
        return NULL;
    }

    size = strlen(alphabet);
    if (size >= INT_MAX) {
        fprintf(stderr, "%s: alphabet is too large\n", __func__);
        return NULL;
    }
    size1 = size + 1;

    PARASAIL_CALLOC(matrix, int, size1*length);

    /* find min and max values */
    for (i=0; i<size*length; ++i) {
        min = values[i] < min ? values[i] : min;
        max = values[i] > max ? values[i] : max;
    }

    for (i=0; i<(size_t)length; ++i) {
        for (j=0; j<size; ++j) {
            matrix[c++] = values[v++];
        }
        matrix[c++] = min;
    }

    PARASAIL_CALLOC(mapper, int, 256);
    parasail_memset_int(mapper, (int)size, 256);
    if (case_sensitive) {
        for (i=0; i<size; ++i) {
            mapper[(unsigned char)alphabet[i]] = (int)i;
        }
    }
    else {
        for (i=0; i<size; ++i) {
            mapper[toupper((unsigned char)alphabet[i])] = (int)i;
            mapper[tolower((unsigned char)alphabet[i])] = (int)i;
        }
    }

    PARASAIL_CALLOC(alphabet_copy, char, size1+1);
    (void)memcpy(alphabet_copy, alphabet, sizeof(char) * size);
    alphabet_copy[size] = '*';
    alphabet_copy[size1] = '\0';

    PARASAIL_NEW(retval, parasail_matrix_t);
    retval->name = "";
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)size1;
    retval->max = max;
    retval->min = min;
    retval->user_matrix = matrix;
    retval->type = PARASAIL_MATRIX_TYPE_PSSM;
    retval->length = length;
    retval->alphabet = alphabet_copy;
    retval->query = NULL;
    return retval;
}